

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_31a1613::RNGState::MixExtract
          (RNGState *this,uchar *out,size_t num,CSHA512 *hasher,bool strong_seed,
          bool always_use_real_rng)

{
  uint64_t *data;
  byte bVar1;
  long in_FS_OFFSET;
  Span<std::byte> out_00;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  uchar buf [64];
  unique_lock<std::mutex> local_88;
  byte local_78 [32];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0x20 < num) {
    __assert_fail("num <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/random.cpp"
                  ,0x1e9,
                  "bool (anonymous namespace)::RNGState::MixExtract(unsigned char *, size_t, CSHA512 &&, bool, bool)"
                 );
  }
  local_88._M_owns = false;
  local_88._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_88);
  bVar1 = strong_seed | this->m_strongly_seeded;
  this->m_strongly_seeded = (bool)bVar1;
  CSHA512::Write(hasher,this->m_state,0x20);
  data = &this->m_counter;
  CSHA512::Write(hasher,(uchar *)data,8);
  *data = *data + 1;
  CSHA512::Finalize(hasher,local_78);
  *(undefined8 *)(this->m_state + 0x10) = local_48;
  *(undefined8 *)(this->m_state + 0x18) = uStack_40;
  *(undefined8 *)this->m_state = local_58;
  *(undefined8 *)(this->m_state + 8) = uStack_50;
  if ((!always_use_real_rng) &&
     ((this->m_deterministic_prng).super__Optional_base<ChaCha20,_false,_false>._M_payload.
      super__Optional_payload<ChaCha20,_true,_false,_false>.super__Optional_payload_base<ChaCha20>.
      _M_engaged == true)) {
    out_00.m_size = num;
    out_00.m_data = local_78;
    ChaCha20::Keystream((ChaCha20 *)&this->m_deterministic_prng,out_00);
    bVar1 = 1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_88);
  if (num != 0) {
    if (out == (uchar *)0x0) {
      __assert_fail("out != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/random.cpp"
                    ,0x203,
                    "bool (anonymous namespace)::RNGState::MixExtract(unsigned char *, size_t, CSHA512 &&, bool, bool)"
                   );
    }
    memcpy(out,local_78,num);
  }
  CSHA512::Reset(hasher);
  memory_cleanse(local_78,0x40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)bVar1;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        assert(num <= 32);
        unsigned char buf[64];
        static_assert(sizeof(buf) == CSHA512::OUTPUT_SIZE, "Buffer needs to have hasher's output size");
        bool ret;
        {
            LOCK(m_mutex);
            ret = (m_strongly_seeded |= strong_seed);
            // Write the current state of the RNG into the hasher
            hasher.Write(m_state, 32);
            // Write a new counter number into the state
            hasher.Write((const unsigned char*)&m_counter, sizeof(m_counter));
            ++m_counter;
            // Finalize the hasher
            hasher.Finalize(buf);
            // Store the last 32 bytes of the hash output as new RNG state.
            memcpy(m_state, buf + 32, 32);
            // Handle requests for deterministic randomness.
            if (!always_use_real_rng && m_deterministic_prng.has_value()) [[unlikely]] {
                // Overwrite the beginning of buf, which will be used for output.
                m_deterministic_prng->Keystream(AsWritableBytes(Span{buf, num}));
                // Do not require strong seeding for deterministic output.
                ret = true;
            }
        }
        // If desired, copy (up to) the first 32 bytes of the hash output as output.
        if (num) {
            assert(out != nullptr);
            memcpy(out, buf, num);
        }
        // Best effort cleanup of internal state
        hasher.Reset();
        memory_cleanse(buf, 64);
        return ret;
    }